

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdGetPrivkeyWif(void *handle,char *privkey,int network_type,bool is_compressed,char **wif)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  Privkey key;
  string privkey_wif;
  bool local_72;
  allocator local_71;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  cfd::Initialize();
  if (wif == (char **)0x0) {
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 1099;
    local_60._M_allocated_capacity = 0x62f247;
    cfd::core::logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"wif is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. wif is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    local_72 = true;
    net_type = cfd::capi::ConvertNetType(network_type,&local_72);
    if (local_72 != false) {
      std::__cxx11::string::string((string *)&local_50,privkey,&local_71);
      cfd::core::Privkey::Privkey((Privkey *)local_70,&local_50,kMainnet,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cfd::core::Privkey::ConvertWif_abi_cxx11_
                (&local_50,(Privkey *)local_70,net_type,is_compressed);
      pcVar2 = cfd::capi::CreateString(&local_50);
      *wif = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_70._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_70._0_8_,local_60._M_allocated_capacity - local_70._0_8_);
      }
      return 0;
    }
    local_70._0_8_ = "cfdcapi_key.cpp";
    local_70._8_4_ = 0x45a;
    local_60._M_allocated_capacity = 0x62f247;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
               "privkey\'s network_type is invalid.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Failed to parameter. privkey\'s network_type is invalid.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcapi_key.cpp";
  local_70._8_4_ = 0x451;
  local_60._M_allocated_capacity = 0x62f247;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_70,kCfdLogLevelWarning,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_70._0_8_ = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"Failed to parameter. privkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyWif(
    void* handle, const char* privkey, int network_type, bool is_compressed,
    char** wif) {
  try {
    cfd::Initialize();
    if (wif == nullptr) {
      warn(CFD_LOG_SOURCE, "wif is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. wif is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    Privkey key(privkey);
    std::string privkey_wif = key.ConvertWif(net_type, is_compressed);
    *wif = CreateString(privkey_wif);

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}